

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

int Ssw_SmlNodesCompareInFrame
              (Ssw_Sml_t *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1,int iFrame0,int iFrame1)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  
  if (p->nFrames <= iFrame0) {
    __assert_fail("iFrame0 < p->nFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x308,
                  "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  if (p->nFrames <= iFrame1) {
    __assert_fail("iFrame1 < p->nFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x309,
                  "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  if (((ulong)pObj0 & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x30a,
                  "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  if (((ulong)pObj1 & 1) == 0) {
    if ((iFrame0 != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
      __assert_fail("iFrame0 == 0 || p->nWordsFrame < p->nWordsTotal",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                    ,0x30c,
                    "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                   );
    }
    if (iFrame1 == 0) {
      uVar2 = p->nWordsFrame;
      iVar3 = p->nWordsTotal;
    }
    else {
      uVar2 = p->nWordsFrame;
      iVar3 = p->nWordsTotal;
      if (iVar3 <= (int)uVar2) {
        __assert_fail("iFrame1 == 0 || p->nWordsFrame < p->nWordsTotal",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                      ,0x30d,
                      "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                     );
      }
    }
    if (0 < (int)uVar2) {
      uVar1 = 0;
      do {
        if (*(int *)((long)&p[1].pAig +
                    uVar1 * 4 + (long)(int)(iFrame0 * uVar2) * 4 + (long)(pObj0->Id * iVar3) * 4) !=
            *(int *)((long)&p[1].pAig +
                    uVar1 * 4 + (long)(int)(iFrame1 * uVar2) * 4 + (long)(iVar3 * pObj1->Id) * 4)) {
          return 0;
        }
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
    return 1;
  }
  __assert_fail("!Aig_IsComplement(pObj1)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                ,0x30b,
                "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
}

Assistant:

int Ssw_SmlNodesCompareInFrame( Ssw_Sml_t * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1, int iFrame0, int iFrame1 )
{
    unsigned * pSims0, * pSims1;
    int i;
    assert( iFrame0 < p->nFrames );
    assert( iFrame1 < p->nFrames );
    assert( !Aig_IsComplement(pObj0) );
    assert( !Aig_IsComplement(pObj1) );
    assert( iFrame0 == 0 || p->nWordsFrame < p->nWordsTotal );
    assert( iFrame1 == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims0  = Ssw_ObjSim(p, pObj0->Id) + p->nWordsFrame * iFrame0;
    pSims1  = Ssw_ObjSim(p, pObj1->Id) + p->nWordsFrame * iFrame1;
    // compare
    for ( i = 0; i < p->nWordsFrame; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}